

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O2

pair<bool,_QPDFObjectHandle> * __thiscall
qpdf::Array::at(pair<bool,_QPDFObjectHandle> *__return_storage_ptr__,Array *this,int n)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  pointer pQVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  QPDF_Array *pQVar5;
  iterator iVar6;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  int local_3c;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_3c = n;
  pQVar5 = array(this);
  if ((n < 0) || (iVar4 = size(this), iVar4 <= n)) {
    local_38._M_ptr = (element_type *)0x0;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->first = false;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &__return_storage_ptr__->second,&local_38);
  }
  else {
    _Var1._M_head_impl =
         (pQVar5->sp)._M_t.
         super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
         super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
    if (_Var1._M_head_impl == (Sparse *)0x0) {
      pQVar2 = (pQVar5->elements).
               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               super__Vector_impl_data._M_start;
      __return_storage_ptr__->first = true;
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &__return_storage_ptr__->second,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(pQVar2 + (uint)n));
      return __return_storage_ptr__;
    }
    iVar6 = std::
            _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
            ::find(&((_Var1._M_head_impl)->elements)._M_t,&local_3c);
    p_Var7 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&null_oh;
    if (iVar6._M_node !=
        (_Base_ptr)
        ((long)&((pQVar5->sp)._M_t.
                 super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>
                 .super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl)->elements + 8U))
    {
      p_Var7 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&iVar6._M_node[1]._M_parent;
    }
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,p_Var7);
    _Var3._M_pi = local_38._M_refcount._M_pi;
    __return_storage_ptr__->first = true;
    local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->second).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38._M_ptr;
    (__return_storage_ptr__->second).super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
    local_38._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, QPDFObjectHandle>
Array::at(int n) const
{
    auto a = array();
    if (n < 0 || n >= size()) {
        return {false, {}};
    }
    if (!a->sp) {
        return {true, a->elements[size_t(n)]};
    }
    auto const& iter = a->sp->elements.find(n);
    return {true, iter == a->sp->elements.end() ? null() : iter->second};
}